

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

QString * QStyleHelper::uniqueName(QString *key,QStyleOption *option,QSize *size,qreal dpr)

{
  bool bVar1;
  char16_t ch;
  Int t;
  Int t_00;
  uint uVar2;
  Int t_01;
  QStyleOptionComplex *pQVar3;
  unsigned_long_long t_02;
  QStyleOptionSpinBox *pQVar4;
  QStyleOption *in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  QStringBuilder<const_QString_&,_HexString<unsigned_int>_> QVar5;
  QStringBuilder<QString_&,_HexString<unsigned_int>_> QVar6;
  QStyleOptionSpinBox *spinBox;
  QStyleOptionComplex *complexOption;
  QString *tmp;
  QStyleOption *in_stack_fffffffffffffdb8;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_QChar>
  *this;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  QChar local_1d6;
  HexString<unsigned_int> local_1d4;
  QString *local_1d0;
  uint local_1c8;
  undefined1 local_1bc [36];
  HexString<unsigned_int> local_198;
  HexString<unsigned_int> local_194;
  HexString<unsigned_long_long> local_190;
  HexString<unsigned_int> local_188;
  HexString<unsigned_int> local_184;
  QString *local_180;
  uint local_178;
  HexString<unsigned_int> local_16c;
  QString *local_168;
  uint local_160;
  QString *local_120;
  uint local_118;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = usePixmapCache(in_stack_fffffffffffffdb8);
  if (bVar1) {
    pQVar3 = qstyleoption_cast<QStyleOptionComplex_const*>(in_RDX);
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    t = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&in_RDX->state);
    HexString<unsigned_int>::HexString(&local_16c,t);
    QVar5 = ::operator%(in_RSI,(HexString<unsigned_int> *)
                               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    local_180 = QVar5.a;
    local_178 = (uint)QVar5.b.val;
    local_120 = local_180;
    local_118 = local_178;
    HexString<unsigned_int>::HexString(&local_184,in_RDX->direction);
    ::operator%((QStringBuilder<const_QString_&,_HexString<unsigned_int>_> *)
                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                (HexString<unsigned_int> *)in_stack_fffffffffffffdb8);
    if (pQVar3 == (QStyleOptionComplex *)0x0) {
      t_00 = 0;
    }
    else {
      t_00 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&pQVar3->activeSubControls);
    }
    HexString<unsigned_int>::HexString(&local_188,t_00);
    ::operator%((QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                 *)CONCAT44(t_00,in_stack_fffffffffffffdc0),
                (HexString<unsigned_int> *)in_stack_fffffffffffffdb8);
    t_02 = QPalette::cacheKey();
    HexString<unsigned_long_long>::HexString(&local_190,t_02);
    ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                 *)CONCAT44(t_00,in_stack_fffffffffffffdc0),
                (HexString<unsigned_long_long> *)in_stack_fffffffffffffdb8);
    uVar2 = QSize::width((QSize *)0x416165);
    HexString<unsigned_int>::HexString(&local_194,uVar2);
    ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>
                 *)CONCAT44(t_00,in_stack_fffffffffffffdc0),
                (HexString<unsigned_int> *)in_stack_fffffffffffffdb8);
    uVar2 = QSize::height((QSize *)0x41619b);
    HexString<unsigned_int>::HexString(&local_198,uVar2);
    ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>
                 *)CONCAT44(t_00,in_stack_fffffffffffffdc0),
                (HexString<unsigned_int> *)in_stack_fffffffffffffdb8);
    HexString<double>::HexString
              ((HexString<double> *)(local_1bc + 0x1c),(double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
    ::operator%((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                 *)CONCAT44(t_00,in_stack_fffffffffffffdc0),
                (HexString<double> *)in_stack_fffffffffffffdb8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<unsigned_long_long>_>,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_HexString<double>_>
                *)in_stack_fffffffffffffdb8);
    pQVar4 = qstyleoption_cast<QStyleOptionSpinBox_const*>(in_RDX);
    if (pQVar4 != (QStyleOptionSpinBox *)0x0) {
      this = (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>,_QChar>
              *)local_1bc;
      HexString<unsigned_int>::HexString((HexString<unsigned_int> *)this,pQVar4->buttonSymbols);
      QVar6 = ::operator%(in_RSI,(HexString<unsigned_int> *)CONCAT44(t_00,in_stack_fffffffffffffdc0)
                         );
      local_1d0 = QVar6.a;
      local_1c8 = (uint)QVar6.b.val;
      local_168 = local_1d0;
      local_160 = local_1c8;
      t_01 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&pQVar4->stepEnabled);
      HexString<unsigned_int>::HexString(&local_1d4,t_01);
      ::operator%((QStringBuilder<QString_&,_HexString<unsigned_int>_> *)
                  CONCAT44(t_00,in_stack_fffffffffffffdc0),(HexString<unsigned_int> *)this);
      ch = L'0';
      if ((pQVar4->frame & 1U) != 0) {
        ch = L'1';
      }
      QChar::QChar<char16_t,_true>(&local_1d6,ch);
      ::operator%((QStringBuilder<QStringBuilder<QString_&,_HexString<unsigned_int>_>,_HexString<unsigned_int>_>
                   *)CONCAT44(t_00,in_stack_fffffffffffffdc0),(QChar *)this);
      ::QStringBuilder::operator_cast_to_QString(this);
      QString::operator=((QString *)CONCAT44(t_00,in_stack_fffffffffffffdc0),(QString *)this);
      QString::~QString((QString *)0x416318);
    }
  }
  else {
    QString::QString((QString *)0x415ffb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString uniqueName(const QString &key, const QStyleOption *option, const QSize &size, qreal dpr)
{
    if (!usePixmapCache(option))
        return {};

    const QStyleOptionComplex *complexOption = qstyleoption_cast<const QStyleOptionComplex *>(option);
    QString tmp = key % HexString<uint>(option->state)
                      % HexString<uint>(option->direction)
                      % HexString<uint>(complexOption ? uint(complexOption->activeSubControls) : 0u)
                      % HexString<quint64>(option->palette.cacheKey())
                      % HexString<uint>(size.width())
                      % HexString<uint>(size.height())
                      % HexString<qreal>(dpr);

#if QT_CONFIG(spinbox)
    if (const QStyleOptionSpinBox *spinBox = qstyleoption_cast<const QStyleOptionSpinBox *>(option)) {
        tmp = tmp % HexString<uint>(spinBox->buttonSymbols)
                  % HexString<uint>(spinBox->stepEnabled)
                  % QChar(spinBox->frame ? u'1' : u'0');
    }
#endif // QT_CONFIG(spinbox)

    return tmp;
}